

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::NewCommand(UCIAdapter *this,char *params)

{
  byte *pbVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  _func_int **pp_Var6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar7;
  _func_int **__s1;
  char *pcVar8;
  char *pcVar9;
  char *move;
  Output local_38;
  Output local_30;
  undefined4 extraout_var;
  
  sVar2 = DAT_001b6788;
  if (DAT_001b6788 == 0) {
    UCINewGameCommand(this,"");
    if (params == (char *)0x0) goto LAB_00134583;
LAB_001344e6:
    sVar2 = DAT_001b6928;
    __s1 = (_func_int **)params;
    if (*params == '\0') goto LAB_0013458b;
    if ((DAT_001b6928 != 0) &&
       (iVar5 = strncmp(params,token::StartPos_abi_cxx11_,DAT_001b6928), iVar5 == 0)) {
      __s1 = (_func_int **)(params + sVar2);
      uVar7 = (uint)params[sVar2];
      if (uVar7 != 0) {
        iVar5 = isspace(uVar7);
        if (iVar5 == 0) goto LAB_00134516;
        do {
          iVar5 = isspace((int)(char)uVar7);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)((long)__s1 + 1);
          uVar7 = (uint)*pbVar1;
          __s1 = (_func_int **)((long)__s1 + 1);
        } while (*pbVar1 != 0);
      }
      goto LAB_0013458b;
    }
LAB_00134516:
    sVar2 = DAT_001b67c8;
    if ((DAT_001b67c8 != 0) &&
       (iVar5 = strncmp(params,token::Moves_abi_cxx11_,DAT_001b67c8), iVar5 == 0)) {
      __s1 = (_func_int **)(params + sVar2);
      uVar7 = (uint)params[sVar2];
      if (uVar7 != 0) {
        iVar5 = isspace(uVar7);
        if (iVar5 == 0) goto LAB_0013453c;
        do {
          iVar5 = isspace((int)(char)uVar7);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)((long)__s1 + 1);
          uVar7 = (uint)*pbVar1;
          __s1 = (_func_int **)((long)__s1 + 1);
        } while (*pbVar1 != 0);
      }
      goto LAB_0013458b;
    }
LAB_0013453c:
    sVar2 = DAT_001b6748;
    pcVar8 = params;
    if ((DAT_001b6748 != 0) &&
       (iVar5 = strncmp(params,token::Fen_abi_cxx11_,DAT_001b6748), iVar5 == 0)) {
      pcVar9 = params + sVar2;
      uVar7 = (uint)params[sVar2];
      pcVar8 = pcVar9;
      if ((uVar7 != 0) && (iVar5 = isspace(uVar7), pcVar8 = params, iVar5 != 0)) {
        do {
          iVar5 = isspace((int)(char)uVar7);
          pcVar8 = pcVar9;
          if (iVar5 == 0) break;
          pbVar1 = (byte *)(pcVar9 + 1);
          uVar7 = (uint)*pbVar1;
          pcVar9 = pcVar9 + 1;
          pcVar8 = pcVar9;
        } while (*pbVar1 != 0);
      }
    }
    iVar5 = (*this->engine->_vptr_ChessEngine[9])(this->engine,pcVar8);
    pp_Var6 = (_func_int **)CONCAT44(extraout_var,iVar5);
    __s1 = pp_Var6;
  }
  else {
    if (params != (char *)0x0) {
      iVar5 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
      if ((iVar5 == 0) &&
         ((params[sVar2] == '\0' || (iVar5 = isspace((int)params[sVar2]), iVar5 != 0)))) {
        Output::Output(&local_38,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,token::New_abi_cxx11_,DAT_001b6808);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,token::Fen_abi_cxx11_,DAT_001b6748);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," <fen_string>] [",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,token::Moves_abi_cxx11_,DAT_001b67c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <movelist>]",0xc)
        ;
        Output::~Output(&local_38);
        Output::Output(&local_38,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Clear search data, set position, and apply <movelist>.",
                   0x36);
        Output::~Output(&local_38);
        Output::Output(&local_38,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"If no position is specified ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is assumed.",0xc)
        ;
        Output::~Output(&local_38);
        return;
      }
      UCINewGameCommand(this,"");
      goto LAB_001344e6;
    }
    UCINewGameCommand(this,"");
LAB_00134583:
    __s1 = (_func_int **)0x0;
LAB_0013458b:
    iVar5 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
    pp_Var6 = (_func_int **)CONCAT44(extraout_var_00,iVar5);
  }
  sVar2 = DAT_001b67c8;
  if (pp_Var6 == (_func_int **)0x0) {
    return;
  }
  if (DAT_001b67c8 == 0) {
    if (__s1 == (_func_int **)0x0) goto LAB_00134907;
  }
  else {
    if (__s1 == (_func_int **)0x0) goto LAB_00134907;
    iVar5 = strncmp((char *)__s1,token::Moves_abi_cxx11_,DAT_001b67c8);
    if (iVar5 == 0) {
      uVar7 = (uint)*(char *)((long)__s1 + sVar2);
      if (uVar7 == 0) goto LAB_00134907;
      iVar5 = isspace(uVar7);
      if (iVar5 != 0) {
        __s1 = (_func_int **)((long)__s1 + sVar2);
        do {
          iVar5 = isspace((int)(char)uVar7);
          if (iVar5 == 0) goto LAB_00134615;
          pbVar1 = (byte *)((long)__s1 + 1);
          uVar7 = (uint)*pbVar1;
          __s1 = (_func_int **)((long)__s1 + 1);
        } while (*pbVar1 != 0);
        goto LAB_00134907;
      }
    }
  }
LAB_00134615:
  do {
    cVar3 = *(char *)__s1;
    while( true ) {
      if (cVar3 == '\0') goto LAB_00134907;
      iVar5 = isspace((int)cVar3);
      if (iVar5 == 0) break;
      cVar3 = *(char *)((long)__s1 + 1);
      __s1 = (_func_int **)((long)__s1 + 1);
    }
    local_38._vptr_Output = __s1;
    bVar4 = IsMove((char *)__s1);
    if (!bVar4) goto LAB_00134907;
    iVar5 = (*this->engine->_vptr_ChessEngine[10])(this->engine,__s1);
    __s1 = (_func_int **)CONCAT44(extraout_var_01,iVar5);
  } while (__s1 != (_func_int **)0x0);
  Output::Output(&local_30,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid move: ",0xe);
  Output::operator<<(&local_30,(char **)&local_38);
  Output::~Output(&local_30);
LAB_00134907:
  if (ChessEngine::_debug == '\x01') {
    (*this->engine->_vptr_ChessEngine[0xc])();
  }
  return;
}

Assistant:

void UCIAdapter::NewCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::New << " [" << token::StartPos << "|"
             << token::Fen << " <fen_string>] [" << token::Moves
             << " <movelist>]";
    Output() << "Clear search data, set position, and apply <movelist>.";
    Output() << "If no position is specified " << token::StartPos
             << " is assumed.";
    return;
  }

  UCINewGameCommand("");

  if (!params || !*params ||
      ParamMatch(token::StartPos, params) ||
      ParamMatch(token::Moves, params))
  {
    if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
      return;
    }
  }
  else {
    ParamMatch(token::Fen, params); // simply consume "fen" token if it present
    if (!(params = engine->SetPosition(params))) {
      return;
    }
  }

  // simply consume "moves" token if present
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}